

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_archive.hpp
# Opt level: O0

result_type __thiscall
pstore::serialize::archive::details::database_writer_policy::put<unsigned_long>
          (database_writer_policy *this,unsigned_long *value)

{
  element_type_conflict1 eVar1;
  element_type_conflict1 *peVar2;
  address aVar3;
  shared_ptr<unsigned_long> local_70 [2];
  pair<std::shared_ptr<unsigned_long>,_pstore::typed_address<unsigned_long>_> local_50;
  typed_address<unsigned_long> local_38;
  typed_address<unsigned_long> addr;
  shared_ptr<unsigned_long> ptr;
  unsigned_long *value_local;
  database_writer_policy *this_local;
  
  std::shared_ptr<unsigned_long>::shared_ptr((shared_ptr<unsigned_long> *)&addr);
  local_38 = typed_address<unsigned_long>::null();
  transaction_base::alloc_rw<unsigned_long,void>(&local_50,this->transaction_,1);
  std::tie<std::shared_ptr<unsigned_long>,pstore::typed_address<unsigned_long>>(local_70,&addr);
  std::tuple<std::shared_ptr<unsigned_long>&,pstore::typed_address<unsigned_long>&>::operator=
            ((tuple<std::shared_ptr<unsigned_long>&,pstore::typed_address<unsigned_long>&> *)
             local_70,&local_50);
  std::pair<std::shared_ptr<unsigned_long>,_pstore::typed_address<unsigned_long>_>::~pair(&local_50)
  ;
  eVar1 = *value;
  peVar2 = std::__shared_ptr_access<unsigned_long,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<unsigned_long,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                     )&addr);
  *peVar2 = eVar1;
  aVar3 = typed_address<unsigned_long>::to_address(&local_38);
  std::shared_ptr<unsigned_long>::~shared_ptr((shared_ptr<unsigned_long> *)&addr);
  return (result_type)aVar3.a_;
}

Assistant:

auto put (Ty const & value) -> result_type {
                        std::shared_ptr<Ty> ptr;
                        auto addr = typed_address<Ty>::null ();
                        std::tie (ptr, addr) = transaction_.template alloc_rw<Ty> ();
                        *ptr = value;
                        return addr.to_address ();
                    }